

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O3

void Abs_ManFreeAray(Vec_Ptr_t *p)

{
  int iVar1;
  long lVar2;
  
  iVar1 = p->nSize;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (p->pArray[lVar2] != (void *)0x0) {
        free(p->pArray[lVar2]);
        iVar1 = p->nSize;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (p->pArray != (void **)0x0) {
    free(p->pArray);
  }
  free(p);
  return;
}

Assistant:

void Abs_ManFreeAray( Vec_Ptr_t * p )
{
    void * pTemp;
    int i;
    Vec_PtrForEachEntry( void *, p, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( p );
}